

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O0

void __thiscall OpenMD::TorsionStamp::~TorsionStamp(TorsionStamp *this)

{
  DataHolder *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_DataHolder = (_func_int **)&PTR__TorsionStamp_005654d0;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  Parameter<int>::~Parameter((Parameter<int> *)0x41474d);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

TorsionStamp::~TorsionStamp() {}